

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O3

void * matras_touch_no_check(matras *m,matras_id_t id)

{
  matras_id_t *pmVar1;
  uint uVar2;
  matras_view *pmVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  matras_allocator *pmVar6;
  undefined8 *__dest;
  undefined8 *puVar7;
  byte bVar8;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  
  if ((m->head).block_count <= (ulong)id) {
    __assert_fail("id < m->head.block_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/matras.h"
                  ,0x178,"_Bool matras_needs_touch(struct matras *, matras_id_t)");
  }
  pmVar3 = (m->head).prev_view;
  if (((pmVar3 == (matras_view *)0x0) || (pmVar3->block_count == 0)) ||
     (bVar8 = (byte)m->shift2,
     (int)pmVar3->block_count - 1U >> (bVar8 & 0x1f) < id >> (bVar8 & 0x1f))) {
    __assert_fail("matras_needs_touch(m, id)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x1cd,"void *matras_touch_no_check(struct matras *, matras_id_t)");
  }
  uVar10 = id >> ((byte)m->shift1 & 0x1f);
  uVar11 = (m->mask1 & id) >> (bVar8 & 0x1f);
  uVar2 = m->mask2;
  puVar4 = (undefined8 *)(m->head).root;
  puVar5 = (undefined8 *)pmVar3->root;
  puVar7 = puVar4;
  if (puVar4 == puVar5) {
    pmVar6 = m->allocator;
    if (0 < pmVar6->num_reserved_extents) {
      puVar7 = (undefined8 *)pmVar6->reserved_extents;
      pmVar6->reserved_extents = (void *)*puVar7;
      pmVar6->num_reserved_extents = pmVar6->num_reserved_extents + -1;
LAB_00104153:
      m->extent_count = m->extent_count + 1;
      m->stats->extent_count = m->stats->extent_count + 1;
      memcpy(puVar7,puVar4,(ulong)m->extent_size);
      pmVar1 = &m->stats->read_view_extent_count;
      *pmVar1 = *pmVar1 + 1;
      (m->head).root = puVar7;
      goto LAB_0010417b;
    }
    puVar7 = (undefined8 *)(*pmVar6->alloc_func)(pmVar6);
    if (puVar7 != (undefined8 *)0x0) goto LAB_00104153;
LAB_00104273:
    pvVar9 = (void *)0x0;
  }
  else {
LAB_0010417b:
    puVar4 = (undefined8 *)puVar7[uVar10];
    puVar5 = (undefined8 *)puVar5[uVar10];
    __dest = puVar4;
    if (puVar4 == puVar5) {
      pmVar6 = m->allocator;
      if (pmVar6->num_reserved_extents < 1) {
        __dest = (undefined8 *)(*pmVar6->alloc_func)(pmVar6);
        if (__dest == (undefined8 *)0x0) goto LAB_00104273;
      }
      else {
        __dest = (undefined8 *)pmVar6->reserved_extents;
        pmVar6->reserved_extents = (void *)*__dest;
        pmVar6->num_reserved_extents = pmVar6->num_reserved_extents + -1;
      }
      m->extent_count = m->extent_count + 1;
      m->stats->extent_count = m->stats->extent_count + 1;
      memcpy(__dest,puVar4,(ulong)m->extent_size);
      pmVar1 = &m->stats->read_view_extent_count;
      *pmVar1 = *pmVar1 + 1;
      puVar7[uVar10] = __dest;
    }
    puVar4 = (undefined8 *)__dest[uVar11];
    puVar7 = puVar4;
    if (puVar4 == (undefined8 *)puVar5[uVar11]) {
      pmVar6 = m->allocator;
      if (pmVar6->num_reserved_extents < 1) {
        puVar7 = (undefined8 *)(*pmVar6->alloc_func)(pmVar6);
        if (puVar7 == (undefined8 *)0x0) goto LAB_00104273;
      }
      else {
        puVar7 = (undefined8 *)pmVar6->reserved_extents;
        pmVar6->reserved_extents = (void *)*puVar7;
        pmVar6->num_reserved_extents = pmVar6->num_reserved_extents + -1;
      }
      m->extent_count = m->extent_count + 1;
      m->stats->extent_count = m->stats->extent_count + 1;
      memcpy(puVar7,puVar4,(ulong)m->extent_size);
      pmVar1 = &m->stats->read_view_extent_count;
      *pmVar1 = *pmVar1 + 1;
      __dest[uVar11] = puVar7;
    }
    pvVar9 = (void *)((ulong)((id & uVar2) * m->block_size) + (long)puVar7);
  }
  return pvVar9;
}

Assistant:

void *
matras_touch_no_check(struct matras *m, matras_id_t id)
{
	assert(matras_needs_touch(m, id));

	/* see "Shifts and masks explanation" for details */
	matras_id_t n1 = id >> m->shift1;
	matras_id_t n2 = (id & m->mask1) >> m->shift2;
	matras_id_t n3 = id & m->mask2;

	void **extent1 = (void **)m->head.root;
	void **extent1p = (void **)m->head.prev_view->root;
	if (extent1 == extent1p) {
		void *new_extent = matras_copy_read_view_extent(m, extent1);
		if (!new_extent)
			return 0;
		m->head.root = new_extent;
		extent1 = (void **)new_extent;
	}

	void **extent2 = (void **)extent1[n1];
	void **extent2p = (void **)extent1p[n1];
	if (extent2 == extent2p) {
		void *new_extent = matras_copy_read_view_extent(m, extent2);
		if (!new_extent)
			return 0;
		extent1[n1] = new_extent;
		extent2 = (void **)new_extent;
	}

	char *extent3 = (char *)extent2[n2];
	char *extent3p = (char *)extent2p[n2];
	if (extent3 == extent3p) {
		void *new_extent = matras_copy_read_view_extent(m, extent3);
		if (!new_extent)
			return 0;
		extent2[n2] = new_extent;
		extent3 = (char *)new_extent;
	}

	return &extent3[n3 * m->block_size];
}